

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_decimal<__int128>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,__int128 value)

{
  undefined2 uVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong in_RDX;
  ulong uVar8;
  ulong in_RSI;
  int iVar9;
  undefined1 *puVar10;
  wchar_t *__dest;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  undefined1 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_168 [312];
  
  uVar6 = in_RDX;
  if ((long)in_RDX < 0) {
    bVar13 = in_RSI != 0;
    in_RSI = -in_RSI;
    uVar6 = -(ulong)bVar13 - in_RDX;
  }
  auVar16._8_8_ = uVar6;
  auVar16._0_8_ = in_RSI;
  iVar9 = 1;
  if ((in_RSI < 10) <= uVar6) {
    iVar4 = 4;
    auVar15 = auVar16;
    do {
      iVar9 = iVar4;
      uVar8 = auVar15._8_8_;
      uVar11 = auVar15._0_8_;
      if (uVar8 == 0 && (ulong)(99 < uVar11) <= -uVar8) {
        iVar9 = iVar9 + -2;
        goto LAB_001a52e3;
      }
      if (uVar8 == 0 && (ulong)(999 < uVar11) <= -uVar8) {
        iVar9 = iVar9 + -1;
        goto LAB_001a52e3;
      }
      if (uVar8 < (uVar11 < 10000)) goto LAB_001a52e3;
      auVar15 = __udivti3(uVar11,uVar8,10000,0);
      iVar4 = iVar9 + 4;
    } while (uVar8 != 0 || -uVar8 < (ulong)(99999 < uVar11));
    iVar9 = iVar9 + 1;
  }
LAB_001a52e3:
  lVar12 = (long)iVar9;
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar8 = (lVar12 - ((long)in_RDX >> 0x3f)) + sVar3;
  if (pbVar2->capacity_ < uVar8) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar8);
  }
  __dest = pbVar2->ptr_ + sVar3;
  pbVar2->size_ = uVar8;
  if ((long)in_RDX < 0) {
    *__dest = L'-';
    __dest = __dest + 1;
  }
  puVar10 = local_168 + lVar12 * 4;
  if ((in_RSI < 100) <= uVar6) {
    do {
      lVar7 = auVar16._8_8_;
      uVar6 = auVar16._0_8_;
      auVar16 = __udivti3(uVar6,lVar7,100,0);
      uVar1 = *(undefined2 *)(basic_data<void>::digits + (uVar6 + auVar16._0_8_ * -100) * 2);
      uVar14 = (undefined1)((ushort)uVar1 >> 8);
      auVar15 = ZEXT416(CONCAT22((short)(CONCAT13(uVar14,CONCAT12(uVar14,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar15 = pshuflw(auVar15,auVar15,0x60);
      *(ulong *)(puVar10 + -8) = CONCAT44(auVar15._4_4_ >> 0x18,auVar15._0_4_ >> 0x18);
      puVar10 = puVar10 + -8;
    } while (lVar7 != 0 || (ulong)-lVar7 < (ulong)(9999 < uVar6));
  }
  if (auVar16._8_8_ == 0 && (ulong)(9 < auVar16._0_8_) <= (ulong)-auVar16._8_8_) {
    uVar5 = auVar16._0_4_ | 0x30;
    lVar7 = -4;
  }
  else {
    uVar6 = auVar16._0_8_ & 0xffffffff;
    *(int *)(puVar10 + -4) = (int)(char)basic_data<void>::digits[(uVar6 * 2 & 0xffffffff) + 1];
    uVar5 = (uint)(char)basic_data<void>::digits[uVar6 * 2];
    lVar7 = -8;
  }
  *(uint *)(puVar10 + lVar7) = uVar5;
  memcpy(__dest,local_168,lVar12 << 2);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }